

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algo_iterable.h
# Opt level: O0

strong_type_from_t<ezy::remove_cvref_t<flattened_range_view<keeper<owner_category_tag,_vector<vector<int,_allocator<int>_>,_allocator<vector<int,_allocator<int>_>_>_>_>_>_>,_ezy::notag_t,_ezy::extract_features_t<strong_type<vector<vector<int,_allocator<int>_>,_allocator<vector<int,_allocator<int>_>_>_>,_RaisedTag,_iterable>_>_>
* __thiscall
ezy::features::algo_iterable::
impl<ezy::strong_type<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_RaisedTag,_ezy::features::iterable>_>
::flatten(strong_type_from_t<ezy::remove_cvref_t<flattened_range_view<keeper<owner_category_tag,_vector<vector<int,_allocator<int>_>,_allocator<vector<int,_allocator<int>_>_>_>_>_>_>,_ezy::notag_t,_ezy::extract_features_t<strong_type<vector<vector<int,_allocator<int>_>,_allocator<vector<int,_allocator<int>_>_>_>,_RaisedTag,_iterable>_>_>
          *__return_storage_ptr__,
         impl<ezy::strong_type<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_RaisedTag,_ezy::features::iterable>_>
         *this)

{
  ezy *this_00;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *range;
  flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *t;
  flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_30;
  impl<ezy::strong_type<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_RaisedTag,_ezy::features::iterable>_>
  *local_18;
  impl<ezy::strong_type<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_RaisedTag,_ezy::features::iterable>_>
  *this_local;
  
  local_18 = this;
  this_local = (impl<ezy::strong_type<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_RaisedTag,_ezy::features::iterable>_>
                *)__return_storage_ptr__;
  this_00 = (ezy *)ezy::detail::
                   strong_type_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_false>
                   ::get((strong_type_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_false>
                          *)this);
  flatten<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            ((ResultRangeType_conflict39 *)&local_30,this_00,range);
  detail::
  make_extended_from<ezy::strong_type<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,____C_A_T_C_H____T_E_S_T____0()::RaisedTag,ezy::features::iterable>,ezy::detail::flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
            (__return_storage_ptr__,(detail *)&local_30,t);
  ezy::detail::
  flattened_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~flattened_range_view(&local_30);
  return __return_storage_ptr__;
}

Assistant:

auto flatten() &&
      {
        return detail::make_extended_from<T>(
          ezy::flatten(static_cast<T&&>(*this).get())
        );
      }